

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O3

FileData * __thiscall GGSock::FileServer::getFileData(FileServer *this,TURI *uri)

{
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var1;
  long lVar2;
  pointer __s2;
  size_t __n;
  int iVar3;
  ulong uVar4;
  pthread_mutex_t *__mutex;
  uint uVar5;
  FileData *pFVar6;
  FileData *local_38;
  
  __mutex = (pthread_mutex_t *)
            &((this->m_impl)._M_t.
              super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
              .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  _Var1._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  pFVar6 = *(FileData **)
            &((_Var1._M_head_impl)->files).
             super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
  ;
  uVar5 = (int)((long)*(pointer *)((long)&(_Var1._M_head_impl)->files + 8) - (long)pFVar6 >> 3) *
          -0x3b13b13b;
  if (0 < (int)uVar5) {
    lVar2 = *(long *)&((_Var1._M_head_impl)->fileUsed).super__Bvector_base<std::allocator<bool>_>;
    __s2 = (uri->_M_dataplus)._M_p;
    __n = uri->_M_string_length;
    uVar4 = 0;
    do {
      if ((((*(ulong *)(lVar2 + (uVar4 >> 6 & 0x3ffffff) * 8) >> (uVar4 & 0x3f) & 1) != 0) &&
          ((pFVar6->info).uri._M_string_length == __n)) &&
         ((__n == 0 || (iVar3 = bcmp((pFVar6->info).uri._M_dataplus._M_p,__s2,__n), iVar3 == 0)))) {
        pthread_mutex_unlock(__mutex);
        return pFVar6;
      }
      uVar4 = uVar4 + 1;
      pFVar6 = pFVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar4);
  }
  pthread_mutex_unlock(__mutex);
  if (getFileData(std::__cxx11::string_const&)::empty == '\0') {
    getFileData();
  }
  else {
    local_38 = &getFileData::empty;
  }
  return local_38;
}

Assistant:

const FileServer::FileData & FileServer::getFileData(const TURI & uri) const {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        for (int i = 0; i < (int) m_impl->files.size(); ++i) {
            if (m_impl->fileUsed[i] == false) {
                continue;
            }

            if (m_impl->files[i].info.uri != uri) {
                continue;
            }

            return m_impl->files[i];
        }
    }

    static FileData empty;
    return empty;
}